

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

_compatible_internalformat_pairs *
gl4cts::TextureViewUtilities::getLegalTextureAndViewInternalformatCombinations(void)

{
  pointer puVar1;
  _view_class view_class;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *in_RDI;
  pointer puVar2;
  pointer puVar3;
  _internalformats view_class_internalformats;
  pair<unsigned_int,_unsigned_int> local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  for (view_class = VIEW_CLASS_128_BITS; view_class != VIEW_CLASS_COUNT;
      view_class = view_class + VIEW_CLASS_96_BITS) {
    getInternalformatsFromViewClass((_internalformats *)&local_48,view_class);
    puVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (puVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
        puVar3 = local_48._M_impl.super__Vector_impl_data._M_start, puVar2 != puVar1;
        puVar2 = puVar2 + 1) {
      for (; puVar3 != puVar1; puVar3 = puVar3 + 1) {
        local_50.first = *puVar2;
        local_50.second = *puVar3;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::emplace_back<std::pair<unsigned_int,unsigned_int>>(in_RDI,&local_50);
        puVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  }
  return (_compatible_internalformat_pairs *)in_RDI;
}

Assistant:

TextureViewUtilities::_compatible_internalformat_pairs TextureViewUtilities::
	getLegalTextureAndViewInternalformatCombinations()
{
	_compatible_internalformat_pairs result;

	/* Iterate over all view classes */
	for (int current_view_class_it = static_cast<int>(VIEW_CLASS_FIRST);
		 current_view_class_it != static_cast<int>(VIEW_CLASS_COUNT); current_view_class_it++)
	{
		_view_class		 current_view_class			= static_cast<_view_class>(current_view_class_it);
		_internalformats view_class_internalformats = getInternalformatsFromViewClass(current_view_class);

		/* Store all combinations in the result vector */
		for (_internalformats_const_iterator left_iterator = view_class_internalformats.begin();
			 left_iterator != view_class_internalformats.end(); left_iterator++)
		{
			for (_internalformats_const_iterator right_iterator = view_class_internalformats.begin();
				 right_iterator != view_class_internalformats.end(); ++right_iterator)
			{
				result.push_back(_internalformat_pair(*left_iterator, *right_iterator));
			} /* for (all internalformats to be used as right-side values) */
		}	 /* for (all internalformats to be used as left-side values) */
	}		  /* for (all view classes) */

	return result;
}